

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

ErrorGenerator * __thiscall
anon_unknown.dwarf_baa8f::ErrorMessages::ErrorGeneratorBuilder
          (ErrorGenerator *__return_storage_ptr__,ErrorMessages *this,string errorMessage)

{
  long *plVar1;
  long in_RDX;
  long *local_30;
  long local_28;
  long local_20;
  long lStack_18;
  
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>((string *)&local_30,this,this + in_RDX);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  plVar1 = (long *)operator_new(0x20);
  *plVar1 = (long)(plVar1 + 2);
  if (local_30 == &local_20) {
    plVar1[2] = local_20;
    plVar1[3] = lStack_18;
  }
  else {
    *plVar1 = (long)local_30;
    plVar1[2] = local_20;
  }
  plVar1[1] = local_28;
  *(long **)&(__return_storage_ptr__->super__Function_base)._M_functor = plVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testJSONHelpers.cxx:40:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testJSONHelpers.cxx:40:10)>
       ::_M_manager;
  return (ErrorGenerator *)
         std::
         _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testJSONHelpers.cxx:40:10)>
         ::_M_manager;
}

Assistant:

ErrorGenerator ErrorGeneratorBuilder(std::string errorMessage)
{
  return [errorMessage](const Json::Value* value, cmJSONState* state) -> void {
    state->AddErrorAtValue(errorMessage, value);
  };
}